

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.h
# Opt level: O0

TransitionModelDiscrete * __thiscall
PlanningUnitMADPDiscrete::GetTransitionModelDiscretePtr(PlanningUnitMADPDiscrete *this)

{
  MultiAgentDecisionProcessDiscreteInterface *pMVar1;
  TransitionModelDiscrete *pTVar2;
  PlanningUnitMADPDiscrete *in_RDI;
  
  pMVar1 = GetMADPDI(in_RDI);
  pTVar2 = (TransitionModelDiscrete *)(**(code **)((long)*pMVar1 + 0x130))();
  return pTVar2;
}

Assistant:

const TransitionModelDiscrete* GetTransitionModelDiscretePtr() const
    {   
#if 0
        std::cerr << 
        "GetTransitionModelDiscretePtr deprecated, use GetProblem->GetTGet()"
            <<std::endl;
#endif
        return(GetMADPDI()->GetTransitionModelDiscretePtr()); 
    }